

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDenseNetwork.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
IDenseNetwork::Forward
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,IDenseNetwork *this,
          SpikeTrain *sample,float simulationTime,bool useStdp)

{
  ILayer *this_00;
  pointer ppIVar1;
  pointer pfVar2;
  size_t sVar3;
  INeuron *pIVar4;
  undefined7 in_register_00000009;
  pointer ppIVar5;
  float extraout_XMM0_Da;
  allocator_type local_35;
  float local_34;
  
  this_00 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
  local_34 = simulationTime;
  (**(code **)(*(long *)this->eventManager + 0x20))
            (this->eventManager,sample,
             *(this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
              super__Vector_impl_data._M_start);
  (**(code **)(*(long *)this->eventManager + 0x10))
            (local_34,this->eventManager,CONCAT71(in_register_00000009,useStdp) & 0xffffffff);
  ppIVar1 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar5 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar5 != ppIVar1; ppIVar5 = ppIVar5 + 1) {
    (*(*ppIVar5)->_vptr_ILayer[3])(local_34);
  }
  ppIVar1 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar5 = (this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar5 != ppIVar1; ppIVar5 = ppIVar5 + 1) {
    (*(*ppIVar5)->_vptr_ILayer[4])();
  }
  sVar3 = ILayer::GetSize((this->layers).super__Vector_base<ILayer_*,_std::allocator<ILayer_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1]);
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,sVar3,&local_35);
  if ((__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    sVar3 = 0;
    do {
      pIVar4 = ILayer::operator[](this_00,sVar3);
      (*pIVar4->_vptr_INeuron[4])(pIVar4);
      pfVar2 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2[sVar3] = extraout_XMM0_Da;
      sVar3 = sVar3 + 1;
    } while (sVar3 < (ulong)((long)(__return_storage_ptr__->
                                   super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar2 >> 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> IDenseNetwork::Forward( const SPIKING_NN::SpikeTrain &sample, float simulationTime, bool useStdp )
{
    ILayer &output = *layers.back();
    eventManager.RegisterSpikeTrain( sample, *layers.front());
    eventManager.RunSimulation( simulationTime, useStdp );
    Relax( simulationTime ).LogBasicStats();

    auto result = std::vector<float>( layers.back()->GetSize());
    for ( size_t idx = 0; idx < result.size(); ++idx ) {
        result[idx] = output[idx]->GetOutput();
    }
    return result;
}